

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

array_container_t * array_container_from_run(run_container_t *arr)

{
  int iVar1;
  int iVar2;
  array_container_t *paVar3;
  uint local_28;
  int run_value;
  int run_end;
  int run_start;
  int rlepos;
  array_container_t *answer;
  run_container_t *arr_local;
  
  iVar2 = run_container_cardinality(arr);
  paVar3 = array_container_create_given_capacity(iVar2);
  paVar3->cardinality = 0;
  for (run_end = 0; run_end < arr->n_runs; run_end = run_end + 1) {
    local_28 = (uint)arr->runs[run_end].value;
    iVar2 = local_28 + arr->runs[run_end].length;
    for (; (int)local_28 <= iVar2; local_28 = local_28 + 1) {
      iVar1 = paVar3->cardinality;
      paVar3->cardinality = iVar1 + 1;
      paVar3->array[iVar1] = (uint16_t)local_28;
    }
  }
  return paVar3;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}